

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(void *ptr_id)

{
  ImGuiID IVar1;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  uint *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  IVar1 = ImGuiWindow::GetID((ImGuiWindow *)GImGui,GImGui->CurrentWindow);
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)CONCAT44(IVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ImGui::PushID(const void* ptr_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(ptr_id);
    window->IDStack.push_back(id);
}